

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O1

double __thiscall
FSAOHDist_NECOF::GetXOHProb_relT_SufficientSFscope
          (FSAOHDist_NECOF *this,Scope *sfSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sfacIndices,Scope *agSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ohIndices)

{
  uint uVar1;
  pointer puVar2;
  pointer pSVar3;
  pointer ppuVar4;
  pointer ppCVar5;
  CPDDiscreteInterface *pCVar6;
  Index IVar7;
  pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  double in_XMM0_Qa;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacIrestr;
  string s;
  stringstream ss;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_210;
  double local_208;
  double local_200;
  allocator_type local_1b8 [392];
  
  local_210 = sfacIndices;
  (*(this->super_FactoredStateAOHDistribution)._vptr_FactoredStateAOHDistribution[5])();
  puVar8 = (agSc->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((agSc->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar8) {
    uVar11 = 1;
    uVar10 = 0;
    do {
      puVar2 = (ohIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = uVar10;
      if ((ulong)((long)(ohIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar10) {
LAB_003ff683:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      uVar12 = (ulong)puVar8[uVar10];
      pSVar3 = (this->_m_sfacSoI).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->_m_sfacSoI).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) * -0x5555555555555555;
      local_200 = in_XMM0_Qa;
      if (uVar9 < uVar12 || uVar9 - uVar12 == 0) goto LAB_003ff683;
      uVar1 = puVar2[uVar10];
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_228,
                 (long)pSVar3[uVar12].super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&pSVar3[uVar12].super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 >> 2,local_1b8);
      pSVar3 = (this->_m_sfacSoI).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->_m_sfacSoI).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) * -0x5555555555555555;
      if (uVar10 < uVar12 || uVar10 - uVar12 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      IndexTools::RestrictIndividualIndicesToNarrowerScope<unsigned_int>
                (local_210,sfSc,pSVar3 + uVar12,&local_228);
      ppuVar4 = (this->_m_stepsize).
                super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_stepsize).
                        super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar4 >> 3) <= uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      IVar7 = IndexTools::IndividualToJointIndicesStepSize(&local_228,ppuVar4[uVar12]);
      ppCVar5 = (this->_m_oHistConditional).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_oHistConditional).
                        super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3) <= uVar12)
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      pCVar6 = ppCVar5[uVar12];
      (*pCVar6->_vptr_CPDDiscreteInterface[2])(pCVar6,(ulong)uVar1,(ulong)IVar7);
      if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        local_208 = in_XMM0_Qa;
        operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        in_XMM0_Qa = local_208;
      }
      in_XMM0_Qa = local_200 * in_XMM0_Qa;
      uVar10 = (ulong)uVar11;
      puVar8 = (agSc->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar11 + 1;
    } while (uVar10 < (ulong)((long)(agSc->super_SDT).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2));
  }
  return in_XMM0_Qa;
}

Assistant:

double FSAOHDist_NECOF::GetXOHProb_relT_SufficientSFscope(
        const Scope& sfSc, const std::vector<Index>& sfacIndices,
        const Scope& agSc, const std::vector<Index>& ohIndices
        ) const
{    
    double p = GetXProb(sfSc, sfacIndices);


    for(Index i=0; i < agSc.size(); i++)
    {
        Index agI=agSc.at(i);
        Index ohI=ohIndices.at(i);

        vector<Index> sfacIrestr(_m_sfacSoI.at(agI).size());
        try{
            IndexTools::RestrictIndividualIndicesToNarrowerScope(
                sfacIndices, sfSc, _m_sfacSoI.at(agI), sfacIrestr );
        }catch(ENoSubScope& e)
        {
            stringstream ss;
            ss <<"Error FSAOHDist_NECOF::GetXOHProb_relT should be called with all state factors on which the observation histories (of the agents in agSc) depend\n";
            ss <<"sfSc="<<sfSc<<", agSc="<<agSc<<endl;
            string s(ss.str());
            cerr << s;
            throw ENoSubScope(s);
        }
        Index x = IndexTools::IndividualToJointIndicesStepSize(sfacIrestr, 
                _m_stepsize.at(agI) );

        double p_i = _m_oHistConditional.at(agI)->Get(ohI, x);
        p *= p_i;
    }

    return p;

}